

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

void __thiscall QProcess::~QProcess(QProcess *this)

{
  QProcessPrivate *this_00;
  QDebug *pQVar1;
  int __sig;
  __pid_t __pid;
  EVP_PKEY_CTX *in_RSI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  undefined4 local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  QDebug local_30;
  char *local_28;
  
  local_28 = *(char **)(in_FS_OFFSET + 0x28);
  (this->super_QIODevice).super_QObject._vptr_QObject = (_func_int **)&PTR_metaObject_0066a668;
  this_00 = (QProcessPrivate *)(this->super_QIODevice).super_QObject.d_ptr.d;
  if (this_00->processState != '\0') {
    local_50 = 2;
    local_3c = 0;
    local_4c = 0;
    uStack_44 = 0;
    local_38 = "default";
    QMessageLogger::warning((QMessageLogger *)&local_30);
    (local_30.stream)->space = false;
    pQVar1 = QDebug::operator<<(&local_30,"QProcess: Destroyed while process (");
    program((QString *)&local_80,this);
    QDir::toNativeSeparators((QString *)&local_68,(QString *)&local_80);
    pQVar1 = QDebug::operator<<(pQVar1,(QString *)&local_68);
    __pid = 0x53a713;
    QDebug::operator<<(pQVar1,") is still running.");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QDebug::~QDebug(&local_30);
    kill(this,__pid,__sig);
    in_RSI = (EVP_PKEY_CTX *)0x7530;
    waitForFinished(this,30000);
  }
  QProcessPrivate::cleanup(this_00,in_RSI);
  QIODevice::~QIODevice(&this->super_QIODevice);
  if (*(char **)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QProcess::~QProcess()
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning().nospace()
            << "QProcess: Destroyed while process (" << QDir::toNativeSeparators(program()) << ") is still running.";
        kill();
        waitForFinished();
    }
    d->cleanup();
}